

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData256 * cfd::core::HashUtil::Sha256D(ByteData256 *__return_storage_ptr__,Script *script)

{
  ByteData local_28;
  
  Script::GetData(&local_28,script);
  Sha256D(__return_storage_ptr__,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256D(const Script &script) {
  return Sha256D(script.GetData());
}